

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

void __thiscall node::backward(node *this)

{
  pointer pptVar1;
  tensor *ptVar2;
  pointer pdVar3;
  tensor *ptVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  
  if (this->isbuild == true) {
    pptVar1 = (this->input).super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = (long)(this->input).super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pptVar1;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      ptVar2 = this->ret;
      pdVar3 = (this->grad_fn).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        ptVar4 = pptVar1[lVar7];
        ptVar4->grad = pdVar3[lVar7] * ptVar2->grad + ptVar4->grad;
        ptVar4->cnt = ptVar4->cnt + -1;
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "backward before forward!";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

virtual void backward(){  //把ret的梯度传向input
        if(!isbuild)  //如果没有forward，无法传梯度。
            throw "backward before forward!";
        for(int i=0;i<input.size();i++){
            input[i]->grad+=grad_fn[i]*ret->grad;
            input[i]->cnt--;

        }
    }